

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O2

void fill_cache<4u>(Cacheblock<4U> *cache,size_t N,size_t depth)

{
  size_t i;
  size_t sVar1;
  long lVar2;
  Cacheblock<4U> *pCVar3;
  Cacheblock<4U> *pCVar4;
  long lVar5;
  bool bVar6;
  
  pCVar3 = cache;
  for (sVar1 = 0; sVar1 != N; sVar1 = sVar1 + 1) {
    lVar5 = 4;
    pCVar4 = pCVar3;
    for (lVar2 = 0; (lVar2 != 4 && (cache[sVar1].ptr[lVar2 + depth] != '\0')); lVar2 = lVar2 + 1) {
      (pCVar3->chars)._M_elems[lVar2] = cache[sVar1].ptr[lVar2 + depth];
      lVar5 = lVar5 + -1;
      pCVar4 = (Cacheblock<4U> *)((pCVar4->chars)._M_elems + 1);
    }
    while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
      (pCVar4->chars)._M_elems[0] = '\0';
      pCVar4 = (Cacheblock<4U> *)((pCVar4->chars)._M_elems + 1);
    }
    pCVar3 = pCVar3 + 1;
  }
  return;
}

Assistant:

static void
fill_cache(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	for (size_t i=0; i < N; ++i) {
		unsigned int j=0;
		while (j < CachedChars && cache[i].ptr[depth+j]) {
			cache[i].chars[j] = cache[i].ptr[depth+j];
			++j;
		}
		while (j < CachedChars) {
			cache[i].chars[j] = 0;
			++j;
		}
	}
}